

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O2

void write_constraints<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,problem *pb)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  lVar1 = ((long)(pb->equal_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(pb->equal_constraints).
                super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,baryonyx::constraint>
              (ctx,pb,(constraint *)
                      ((long)&(((pb->equal_constraints).
                                super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                                ._M_impl.super__Vector_impl_data._M_start)->label)._M_len + lVar2),
               " = ");
    lVar2 = lVar2 + 0x30;
  }
  lVar2 = 0;
  lVar1 = ((long)(pb->greater_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(pb->greater_constraints).
                super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,baryonyx::constraint>
              (ctx,pb,(constraint *)
                      ((long)&(((pb->greater_constraints).
                                super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                                ._M_impl.super__Vector_impl_data._M_start)->label)._M_len + lVar2),
               " >= ");
    lVar2 = lVar2 + 0x30;
  }
  lVar1 = ((long)(pb->less_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(pb->less_constraints).
                super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30;
  lVar2 = 0;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,baryonyx::constraint>
              (ctx,pb,(constraint *)
                      ((long)&(((pb->less_constraints).
                                super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                                ._M_impl.super__Vector_impl_data._M_start)->label)._M_len + lVar2),
               " <= ");
    lVar2 = lVar2 + 0x30;
  }
  return;
}

Assistant:

void
write_constraints(FormatContext& ctx, const Problem& pb)
{
    for (std::size_t i = 0, e = pb.equal_constraints.size(); i != e; ++i)
        write_constraint(ctx, pb, pb.equal_constraints[i], " = ");

    for (std::size_t i = 0, e = pb.greater_constraints.size(); i != e; ++i)
        write_constraint(ctx, pb, pb.greater_constraints[i], " >= ");

    for (std::size_t i = 0, e = pb.less_constraints.size(); i != e; ++i)
        write_constraint(ctx, pb, pb.less_constraints[i], " <= ");
}